

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

Err * vm_run_string(VM *vm,int pkg,char *code)

{
  Err *pEVar1;
  int ins_idx;
  
  pEVar1 = parse(vm,pkg,(char *)0x0,code);
  if (pEVar1 == (Err *)0x0) {
    vm_run(vm,vm->pkgs[pkg].main_fn,ins_idx);
  }
  return pEVar1;
}

Assistant:

Err * vm_run_string(VM *vm, int pkg, char *code) {
	// TODO: save and restore VM state in case of error

	// Parse the source code
	Err *err = parse(vm, pkg, NULL, code);
	if (err != NULL) {
		return err;
	}

	// Run the code
	return vm_run(vm, vm->pkgs[pkg].main_fn, 0);
}